

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O1

Hop_Obj_t * Abc_RecToHop3(Hop_Man_t *pMan,If_Man_t *pIfMan,If_Cut_t *pCut,If_Obj_t *pIfObj)

{
  Gia_Man_t *p;
  ulong *puVar1;
  Vec_Mem_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  Gia_Obj_t *pGVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  word *pwVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  Hop_Obj_t *pHVar12;
  void **ppvVar13;
  byte bVar14;
  uint uVar15;
  Gia_Obj_t *pGVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong *puVar20;
  Gia_Obj_t *pGVar21;
  If_Cut_t *pIVar22;
  Lms_Man_t *pLVar23;
  ulong *puVar24;
  uint uVar25;
  int iVar26;
  ulong *puVar27;
  uint uVar28;
  uint uVar29;
  long lVar31;
  bool bVar32;
  bool bVar33;
  uint uCanonPhase;
  word *tLimit;
  int BestPo;
  char pCanonPerm [16];
  uint local_8c;
  ulong *local_88;
  If_Cut_t *local_80;
  Gia_Man_t *local_78;
  Hop_Man_t *local_70;
  undefined8 local_68;
  Lms_Man_t *local_60;
  int local_54;
  If_Man_t *local_50;
  char local_48 [24];
  ulong *puVar30;
  
  pLVar23 = s_pMan3;
  local_8c = 0;
  p = s_pMan3->pGia;
  local_54 = -1;
  local_70 = pMan;
  if (pIfMan->pPars->fCutMin != 1) {
    __assert_fail("pIfMan->pPars->fCutMin == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x410,"Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)"
                 );
  }
  uVar28 = pCut->iCutFunc;
  if ((int)uVar28 < 0) {
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                  ,0x1b8,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
  }
  uVar15 = *(uint *)&pCut->field_0x1c;
  uVar29 = uVar15 >> 0x18;
  puVar30 = (ulong *)(ulong)uVar29;
  puVar1 = pIfMan->puTempW;
  pVVar2 = pIfMan->vTtMem[(long)puVar30];
  if (pVVar2 == (Vec_Mem_t *)0x0) {
    pwVar9 = (word *)0x0;
  }
  else {
    uVar7 = uVar28 >> 1;
    if (pVVar2->nEntries <= (int)uVar7) {
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    pwVar9 = pVVar2->ppPages[uVar7 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
             (ulong)(uVar7 & pVVar2->PageMask) * (long)pVVar2->nEntrySize;
  }
  uVar7 = pIfMan->nTruth6Words[(long)puVar30];
  local_68 = (Gia_Obj_t *)(CONCAT44(local_68._4_4_,uVar28) & 0xffffffff00000001);
  if ((uVar28 & 1) == 0) {
    if (0 < (int)uVar7) {
      uVar19 = 0;
      do {
        puVar1[uVar19] = pwVar9[uVar19];
        uVar19 = uVar19 + 1;
      } while (uVar7 != uVar19);
    }
  }
  else if (0 < (int)uVar7) {
    uVar19 = 0;
    do {
      puVar1[uVar19] = ~pwVar9[uVar19];
      uVar19 = uVar19 + 1;
    } while (uVar7 != uVar19);
  }
  uVar28 = 0;
  local_60 = pLVar23;
  if (0xffffff < uVar15) {
    iVar8 = uVar29 - 6;
    uVar7 = 1 << ((byte)iVar8 & 0x1f);
    local_88 = puVar1 + (int)uVar7;
    if ((int)uVar7 < 2) {
      uVar7 = 1;
    }
    puVar20 = (ulong *)0x0;
    uVar28 = 0;
    do {
      bVar6 = (byte)puVar20;
      if (uVar15 < 0x7000000) {
        bVar32 = (s_Truths6Neg[(long)puVar20] &
                 (*puVar1 >> ((byte)(1 << (bVar6 & 0x1f)) & 0x3f) ^ *puVar1)) == 0;
      }
      else {
        bVar32 = true;
        if (&DAT_00000005 < puVar20) {
          if (iVar8 != 0x1f) {
            bVar14 = (byte)(undefined1 *)((long)puVar20 + -6);
            uVar25 = 1 << (bVar14 & 0x1f);
            iVar26 = 2 << (bVar14 & 0x1f);
            uVar19 = 1;
            if (1 < (int)uVar25) {
              uVar19 = (ulong)uVar25;
            }
            puVar24 = puVar1 + (int)uVar25;
            puVar27 = puVar1;
            do {
              if ((undefined1 *)((long)puVar20 + -6) != (undefined1 *)0x1f) {
                uVar17 = 0;
                do {
                  if (puVar27[uVar17] != puVar24[uVar17]) {
                    bVar32 = false;
                    goto LAB_002f9204;
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar19 != uVar17);
              }
              puVar27 = puVar27 + iVar26;
              puVar24 = puVar24 + iVar26;
            } while (puVar27 < local_88);
          }
        }
        else if (iVar8 != 0x1f) {
          lVar31 = 0;
          do {
            bVar32 = ((puVar1[lVar31] >> ((byte)(1 << (bVar6 & 0x1f)) & 0x3f) ^ puVar1[lVar31]) &
                     s_Truths6Neg[(long)puVar20]) == 0;
            if (!bVar32) break;
            bVar33 = (ulong)uVar7 - 1 != lVar31;
            lVar31 = lVar31 + 1;
          } while (bVar33);
        }
      }
LAB_002f9204:
      uVar25 = 1 << (bVar6 & 0x1f);
      if (bVar32) {
        uVar25 = 0;
      }
      uVar28 = uVar28 | uVar25;
      puVar20 = (ulong *)((long)puVar20 + 1);
    } while (puVar20 != puVar30);
  }
  if (uVar28 == 0) {
    pHVar12 = pMan->pConst1;
    uVar28 = (uint)local_68 ^ 1;
  }
  else {
    local_80 = pCut;
    local_78 = p;
    local_50 = pIfMan;
    if ((int)uVar28 < 1) {
      __assert_fail("Supp > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x575,"int Abc_TtSuppIsMinBase(int)");
    }
    if ((uVar28 == 1) || ((uVar28 + 1 & uVar28) != 0)) {
      if ((uVar28 & uVar28 - 1) != 0) {
        __assert_fail("Abc_TtSuppOnlyOne(uSupport)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x418,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      uVar15 = 0;
      do {
        if ((uVar28 >> (uVar15 & 0x1f) & 1) != 0) goto LAB_002f931f;
        uVar15 = uVar15 + 1;
      } while (uVar15 != 0x20);
      uVar15 = 0xffffffff;
LAB_002f931f:
      pHVar12 = Hop_IthVar(pMan,uVar15);
      uVar28 = local_80->iCutFunc;
      if ((int)uVar28 < 0) {
        __assert_fail("pCut->iCutFunc >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                      ,0x1b5,"int If_CutTruthIsCompl(If_Cut_t *)");
      }
    }
    else {
      uVar28 = (uVar28 >> 1 & 0x15555555) + (uVar28 & 0x55555555);
      uVar28 = (uVar28 >> 2 & 0x13333333) + (uVar28 & 0x33333333);
      uVar28 = (uVar28 >> 4 & 0x7070707) + (uVar28 & 0x7070707);
      uVar28 = (uVar28 >> 8 & 0xf000f) + (uVar28 & 0xf000f);
      if ((uVar28 >> 0x10) + (uVar28 & 0xffff) != uVar29) {
        __assert_fail("Gia_WordCountOnes(uSupport) == nLeaves",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x41b,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      If_CutFindBestStruct(pIfMan,pCut,local_48,&local_8c,&local_54);
      if ((long)local_54 < 0) {
        __assert_fail("BestPo >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x41f,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      if (p->vCos->nSize <= local_54) {
LAB_002f9372:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = p->vCos->pArray[local_54];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
LAB_002f9391:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar21 = p->pObjs + iVar8;
      if (p->vTtNodes == (Vec_Int_t *)0x0) {
        pVVar10 = (Vec_Int_t *)malloc(0x10);
        pVVar10->nCap = 0x100;
        pVVar10->nSize = 0;
        piVar11 = (int *)malloc(0x400);
        pVVar10->pArray = piVar11;
        p->vTtNodes = pVVar10;
      }
      local_88 = puVar30;
      if (((int)(uint)*(undefined8 *)(pGVar21 + -(*(ulong *)pGVar21 & 0x1fffffff)) < 0) ||
         (((uint)*(undefined8 *)(pGVar21 + -(*(ulong *)pGVar21 & 0x1fffffff)) & 0x1fffffff) ==
          0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd( Gia_ObjFanin0(pGiaPo) )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x424,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      local_68 = pGVar21;
      Gia_ObjCollectInternal(p,pGVar21 + -(*(ulong *)pGVar21 & 0x1fffffff));
      uVar28 = local_8c;
      if (p->vTtNodes->nSize < 1) {
        __assert_fail("Vec_IntSize(pGia->vTtNodes) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x426,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      pLVar23->vLabelsP->nSize = 0;
      if (0xffffff < uVar15) {
        local_80 = (If_Cut_t *)((ulong)local_88 & 0xffffffff);
        pIVar22 = (If_Cut_t *)0x0;
        do {
          pVVar3 = pLVar23->vLabelsP;
          pHVar12 = Hop_IthVar(local_70,(int)local_48[(long)pIVar22]);
          uVar15 = pVVar3->nCap;
          if (pVVar3->nSize == uVar15) {
            if ((int)uVar15 < 0x10) {
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar13 = (void **)malloc(0x80);
              }
              else {
                ppvVar13 = (void **)realloc(pVVar3->pArray,0x80);
              }
              pVVar3->pArray = ppvVar13;
              iVar8 = 0x10;
            }
            else {
              iVar8 = uVar15 * 2;
              if (iVar8 <= (int)uVar15) goto LAB_002f8dfc;
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar13 = (void **)malloc((ulong)uVar15 << 4);
              }
              else {
                ppvVar13 = (void **)realloc(pVVar3->pArray,(ulong)uVar15 << 4);
              }
              pVVar3->pArray = ppvVar13;
            }
            pVVar3->nCap = iVar8;
          }
LAB_002f8dfc:
          iVar8 = pVVar3->nSize;
          pVVar3->nSize = iVar8 + 1;
          pVVar3->pArray[iVar8] =
               (void *)((ulong)((uVar28 >> ((uint)pIVar22 & 0x1f) & 1) != 0) ^ (ulong)pHVar12);
          pIVar22 = (If_Cut_t *)((long)&pIVar22->Area + 1);
          pLVar23 = local_60;
        } while (local_80 != pIVar22);
      }
      pVVar10 = local_78->vTtNodes;
      lVar31 = 0;
      do {
        iVar8 = pVVar10->pArray[lVar31];
        if (((long)iVar8 < 0) || (local_78->nObjs <= iVar8)) goto LAB_002f9391;
        pGVar21 = local_78->pObjs + iVar8;
        uVar19 = *(ulong *)pGVar21;
        *(ulong *)pGVar21 = uVar19 & 0xffffffffbfffffff;
        uVar17 = (ulong)((uint)uVar19 & 0x1fffffff);
        uVar28 = (uint)*(undefined8 *)(pGVar21 + -uVar17);
        pVVar3 = pLVar23->vLabelsP;
        if ((~uVar28 & 0x1fffffff) == 0 || (int)uVar28 < 0) {
          if (-1 < (int)uVar28) goto LAB_002f93cf;
          uVar28 = (uint)((ulong)*(undefined8 *)(pGVar21 + -uVar17) >> 0x20);
          if (pVVar3->nSize <= (int)(uVar28 & 0x1fffffff)) goto LAB_002f9353;
          uVar17 = (ulong)(uVar28 << 3);
        }
        else {
          pGVar16 = pGVar21 + -uVar17;
          pGVar5 = local_78->pObjs;
          if ((pGVar16 < pGVar5) || (pGVar5 + local_78->nObjs <= pGVar16)) goto LAB_002f93b0;
          uVar28 = (int)((long)pGVar16 - (long)pGVar5 >> 2) * -0x55555555;
          if (((int)uVar28 < 0) || (local_78->vTtNums->nSize <= (int)uVar28)) goto LAB_002f9372;
          uVar28 = local_78->vTtNums->pArray[uVar28 & 0x7fffffff] + (int)local_88;
          if (((int)uVar28 < 0) || (pVVar3->nSize <= (int)uVar28)) goto LAB_002f9353;
          uVar17 = (ulong)uVar28 << 3;
        }
        uVar28 = (uint)(uVar19 >> 0x20);
        uVar18 = (ulong)(uVar28 & 0x1fffffff);
        uVar15 = (uint)*(undefined8 *)(pGVar21 + -uVar18);
        pVVar4 = pLVar23->vLabelsP;
        if ((~uVar15 & 0x1fffffff) == 0 || (int)uVar15 < 0) {
          if (-1 < (int)uVar15) {
LAB_002f93cf:
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          uVar15 = (uint)((ulong)*(undefined8 *)(pGVar21 + -uVar18) >> 0x20);
          if (pVVar4->nSize <= (int)(uVar15 & 0x1fffffff)) goto LAB_002f9353;
          uVar18 = (ulong)(uVar15 << 3);
        }
        else {
          pGVar16 = pGVar21 + -uVar18;
          pGVar5 = local_78->pObjs;
          if ((pGVar16 < pGVar5) || (pGVar5 + local_78->nObjs <= pGVar16)) goto LAB_002f93b0;
          uVar15 = (int)((long)pGVar16 - (long)pGVar5 >> 2) * -0x55555555;
          if (((int)uVar15 < 0) || (local_78->vTtNums->nSize <= (int)uVar15)) goto LAB_002f9372;
          uVar15 = local_78->vTtNums->pArray[uVar15 & 0x7fffffff] + (int)local_88;
          if (((int)uVar15 < 0) || (pVVar4->nSize <= (int)uVar15)) goto LAB_002f9353;
          uVar18 = (ulong)uVar15 << 3;
        }
        pHVar12 = Hop_And(local_70,(Hop_Obj_t *)
                                   ((ulong)((uint)(uVar19 >> 0x1d) & 1) ^
                                   *(ulong *)(uVar17 + (long)pVVar3->pArray)),
                          (Hop_Obj_t *)
                          ((ulong)(uVar28 >> 0x1d & 1) ^ *(ulong *)(uVar18 + (long)pVVar4->pArray)))
        ;
        pVVar3 = pLVar23->vLabelsP;
        uVar28 = pVVar3->nCap;
        if (pVVar3->nSize == uVar28) {
          if ((int)uVar28 < 0x10) {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar13 = (void **)malloc(0x80);
            }
            else {
              ppvVar13 = (void **)realloc(pVVar3->pArray,0x80);
            }
            pVVar3->pArray = ppvVar13;
            iVar8 = 0x10;
          }
          else {
            iVar8 = uVar28 * 2;
            if (iVar8 <= (int)uVar28) goto LAB_002f90b8;
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar13 = (void **)malloc((ulong)uVar28 << 4);
            }
            else {
              ppvVar13 = (void **)realloc(pVVar3->pArray,(ulong)uVar28 << 4);
            }
            pVVar3->pArray = ppvVar13;
          }
          pVVar3->nCap = iVar8;
        }
LAB_002f90b8:
        iVar8 = pVVar3->nSize;
        pVVar3->nSize = iVar8 + 1;
        pVVar3->pArray[iVar8] = pHVar12;
        lVar31 = lVar31 + 1;
        pVVar10 = local_78->vTtNodes;
      } while (lVar31 < pVVar10->nSize);
      if (((int)(uint)*(undefined8 *)pGVar21 < 0) ||
         (((uint)*(undefined8 *)pGVar21 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pGiaTemp)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x440,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      pGVar5 = local_78->pObjs;
      if ((pGVar21 < pGVar5) || (pGVar5 + local_78->nObjs <= pGVar21)) {
LAB_002f93b0:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar28 = (int)((long)pGVar21 - (long)pGVar5 >> 2) * -0x55555555;
      if (((int)uVar28 < 0) || (local_78->vTtNums->nSize <= (int)uVar28)) goto LAB_002f9372;
      uVar28 = local_78->vTtNums->pArray[uVar28 & 0x7fffffff] + (int)local_88;
      if (((int)uVar28 < 0) || (pLVar23->vLabelsP->nSize <= (int)uVar28)) {
LAB_002f9353:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pHVar12 = (Hop_Obj_t *)pLVar23->vLabelsP->pArray[uVar28];
      uVar28 = local_8c >> ((byte)local_88 & 0x1f) ^ *(uint *)local_68 >> 0x1d;
    }
    uVar28 = uVar28 & 1;
  }
  return (Hop_Obj_t *)((ulong)uVar28 ^ (ulong)pHVar12);
}

Assistant:

Hop_Obj_t * Abc_RecToHop3( Hop_Man_t * pMan, If_Man_t * pIfMan, If_Cut_t * pCut, If_Obj_t * pIfObj )
{
    Lms_Man_t * p = s_pMan3;
    char pCanonPerm[LMS_VAR_MAX];
    unsigned uCanonPhase = 0;
    Hop_Obj_t * pFan0, * pFan1, * pHopObj;
    Gia_Man_t * pGia = p->pGia;
    Gia_Obj_t * pGiaPo, * pGiaTemp = NULL;
    int i, uSupport, BestPo = -1, nLeaves = If_CutLeaveNum(pCut);
    assert( pIfMan->pPars->fCutMin == 1 );

    // compute support
    uSupport = Abc_TtSupport( If_CutTruthW(pIfMan, pCut), nLeaves );
    if ( uSupport == 0 )
        return Hop_NotCond( Hop_ManConst0(pMan), If_CutTruthIsCompl(pCut) );
    if ( !Abc_TtSuppIsMinBase(uSupport) || uSupport == 1 )
    {
        assert( Abc_TtSuppOnlyOne(uSupport) );
        return Hop_NotCond( Hop_IthVar(pMan, Abc_TtSuppFindFirst(uSupport)), If_CutTruthIsCompl(pCut) );
    }
    assert( Gia_WordCountOnes(uSupport) == nLeaves );

    // get the best output for this node
    If_CutFindBestStruct( pIfMan, pCut, pCanonPerm, &uCanonPhase, &BestPo );
    assert( BestPo >= 0 );
    pGiaPo = Gia_ManCo( pGia, BestPo );
    // collect internal nodes into pGia->vTtNodes
    if ( pGia->vTtNodes == NULL )
        pGia->vTtNodes = Vec_IntAlloc( 256 );
    assert( Gia_ObjIsAnd( Gia_ObjFanin0(pGiaPo) ) );
    Gia_ObjCollectInternal( pGia, Gia_ObjFanin0(pGiaPo) );
    assert( Vec_IntSize(pGia->vTtNodes) > 0 );

    // collect HOP nodes for leaves
    Vec_PtrClear( p->vLabelsP );
    for ( i = 0; i < nLeaves; i++ )
        Vec_PtrPush( p->vLabelsP, Hop_NotCond(Hop_IthVar(pMan, pCanonPerm[i]), (uCanonPhase >> i) & 1) );

    // compute HOP nodes for internal nodes
    Gia_ManForEachObjVec( pGia->vTtNodes, pGia, pGiaTemp, i )
    {
        pGiaTemp->fMark0 = 0; // unmark node marked by Gia_ObjCollectInternal()
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pGiaTemp)) )
            pFan0 = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjNum(pGia, Gia_ObjFanin0(pGiaTemp)) + nLeaves);
        else
            pFan0 = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjCioId(Gia_ObjFanin0(pGiaTemp)));
        pFan0 = Hop_NotCond(pFan0, Gia_ObjFaninC0(pGiaTemp));
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pGiaTemp)) )
            pFan1 = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjNum(pGia, Gia_ObjFanin1(pGiaTemp)) + nLeaves);
        else
            pFan1 = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjCioId(Gia_ObjFanin1(pGiaTemp)));
        pFan1 = Hop_NotCond(pFan1, Gia_ObjFaninC1(pGiaTemp));

        pHopObj = Hop_And(pMan, pFan0, pFan1);
        Vec_PtrPush(p->vLabelsP, pHopObj);
    }
    // get the final result
    assert( Gia_ObjIsAnd(pGiaTemp) );
    pHopObj = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjNum(pGia, pGiaTemp) + nLeaves);
    // complement the result if needed
    return Hop_NotCond( pHopObj,  Gia_ObjFaninC0(pGiaPo) ^ ((uCanonPhase >> nLeaves) & 1) );    
}